

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlreader(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  uint uVar79;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlreader : 76 of 86 functions ...\n");
  }
  iVar1 = test_xmlNewTextReader();
  iVar2 = test_xmlNewTextReaderFilename();
  iVar3 = test_xmlReaderForDoc();
  iVar4 = test_xmlReaderForFile();
  iVar5 = test_xmlReaderForMemory();
  iVar6 = test_xmlReaderNewDoc();
  iVar7 = test_xmlReaderNewFile();
  iVar8 = test_xmlReaderNewMemory();
  iVar9 = test_xmlReaderNewWalker();
  iVar10 = test_xmlReaderWalker();
  iVar11 = test_xmlTextReaderAttributeCount();
  iVar12 = test_xmlTextReaderBaseUri();
  iVar13 = test_xmlTextReaderByteConsumed();
  iVar14 = test_xmlTextReaderClose();
  iVar15 = test_xmlTextReaderConstBaseUri();
  iVar16 = test_xmlTextReaderConstEncoding();
  iVar17 = test_xmlTextReaderConstLocalName();
  iVar18 = test_xmlTextReaderConstName();
  iVar19 = test_xmlTextReaderConstNamespaceUri();
  iVar20 = test_xmlTextReaderConstPrefix();
  iVar21 = test_xmlTextReaderConstString();
  iVar22 = test_xmlTextReaderConstValue();
  iVar23 = test_xmlTextReaderConstXmlLang();
  iVar24 = test_xmlTextReaderConstXmlVersion();
  iVar25 = test_xmlTextReaderCurrentDoc();
  iVar26 = test_xmlTextReaderCurrentNode();
  iVar27 = test_xmlTextReaderDepth();
  iVar28 = test_xmlTextReaderExpand();
  iVar29 = test_xmlTextReaderGetAttribute();
  iVar30 = test_xmlTextReaderGetAttributeNo();
  iVar31 = test_xmlTextReaderGetAttributeNs();
  iVar32 = test_xmlTextReaderGetErrorHandler();
  iVar33 = test_xmlTextReaderGetParserColumnNumber();
  iVar34 = test_xmlTextReaderGetParserLineNumber();
  iVar35 = test_xmlTextReaderGetParserProp();
  iVar36 = test_xmlTextReaderGetRemainder();
  iVar37 = test_xmlTextReaderHasAttributes();
  iVar38 = test_xmlTextReaderHasValue();
  iVar39 = test_xmlTextReaderIsDefault();
  iVar40 = test_xmlTextReaderIsEmptyElement();
  iVar41 = test_xmlTextReaderIsNamespaceDecl();
  iVar42 = test_xmlTextReaderIsValid();
  iVar43 = test_xmlTextReaderLocalName();
  iVar44 = test_xmlTextReaderLocatorBaseURI();
  iVar45 = test_xmlTextReaderLocatorLineNumber();
  iVar46 = test_xmlTextReaderLookupNamespace();
  iVar47 = test_xmlTextReaderMoveToAttribute();
  iVar48 = test_xmlTextReaderMoveToAttributeNo();
  iVar49 = test_xmlTextReaderMoveToAttributeNs();
  iVar50 = test_xmlTextReaderMoveToElement();
  iVar51 = test_xmlTextReaderMoveToFirstAttribute();
  iVar52 = test_xmlTextReaderMoveToNextAttribute();
  iVar53 = test_xmlTextReaderName();
  iVar54 = test_xmlTextReaderNamespaceUri();
  iVar55 = test_xmlTextReaderNext();
  iVar56 = test_xmlTextReaderNextSibling();
  iVar57 = test_xmlTextReaderNodeType();
  iVar58 = test_xmlTextReaderNormalization();
  iVar59 = test_xmlTextReaderPrefix();
  iVar60 = test_xmlTextReaderPreserve();
  iVar61 = test_xmlTextReaderPreservePattern();
  iVar62 = test_xmlTextReaderQuoteChar();
  iVar63 = test_xmlTextReaderRead();
  iVar64 = test_xmlTextReaderReadAttributeValue();
  iVar65 = test_xmlTextReaderReadState();
  iVar66 = test_xmlTextReaderRelaxNGSetSchema();
  iVar67 = test_xmlTextReaderRelaxNGValidate();
  iVar68 = test_xmlTextReaderRelaxNGValidateCtxt();
  iVar69 = test_xmlTextReaderSchemaValidate();
  iVar70 = test_xmlTextReaderSchemaValidateCtxt();
  iVar71 = test_xmlTextReaderSetErrorHandler();
  iVar72 = test_xmlTextReaderSetParserProp();
  iVar73 = test_xmlTextReaderSetSchema();
  iVar74 = test_xmlTextReaderSetStructuredErrorHandler();
  iVar75 = test_xmlTextReaderSetup();
  iVar76 = test_xmlTextReaderStandalone();
  iVar77 = test_xmlTextReaderValue();
  iVar78 = test_xmlTextReaderXmlLang();
  uVar79 = iVar78 + iVar77 + iVar76 + iVar75 + iVar74 + iVar73 + iVar72 + iVar71 + iVar70 + iVar69 +
                                                                                            iVar68 +
                                                                                            iVar67 +
                                                                                            iVar66 +
                                                                                            iVar65 +
                                                                                            iVar64 +
                                                                                            iVar63 +
                                                                                            iVar62 +
                                                                                            iVar61 +
                                                                                            iVar60 +
                                                                                            iVar59 +
                                                                                            iVar58 +
                                                                                            iVar57 +
                                                                                            iVar56 +
                                                                                            iVar55 +
                                                                                            iVar54 +
                                                                                            iVar53 +
                                                                                            iVar52 +
                                                                                            iVar51 +
                                                                                            iVar50 +
                                                                                            iVar49 +
                                                                                            iVar48 +
                                                                                            iVar47 +
                                                                                            iVar46 +
                                                                                            iVar45 +
                                                                                            iVar44 +
                                                                                            iVar43 +
                                                                                            iVar42 +
                                                                                            iVar41 +
                                                                                            iVar40 +
                                                                                            iVar39 +
                                                                                            iVar38 +
                                                                                            iVar37 +
                                                                                            iVar36 +
                                                                                            iVar35 +
                                                                                            iVar34 +
                                                                                            iVar33 +
                                                                                            iVar32 +
                                                                                            iVar31 +
                                                                                            iVar30 +
                                                                                            iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar79 != 0) {
    printf("Module xmlreader: %d errors\n",(ulong)uVar79);
  }
  return uVar79;
}

Assistant:

static int
test_xmlreader(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlreader : 76 of 86 functions ...\n");
    test_ret += test_xmlNewTextReader();
    test_ret += test_xmlNewTextReaderFilename();
    test_ret += test_xmlReaderForDoc();
    test_ret += test_xmlReaderForFile();
    test_ret += test_xmlReaderForMemory();
    test_ret += test_xmlReaderNewDoc();
    test_ret += test_xmlReaderNewFile();
    test_ret += test_xmlReaderNewMemory();
    test_ret += test_xmlReaderNewWalker();
    test_ret += test_xmlReaderWalker();
    test_ret += test_xmlTextReaderAttributeCount();
    test_ret += test_xmlTextReaderBaseUri();
    test_ret += test_xmlTextReaderByteConsumed();
    test_ret += test_xmlTextReaderClose();
    test_ret += test_xmlTextReaderConstBaseUri();
    test_ret += test_xmlTextReaderConstEncoding();
    test_ret += test_xmlTextReaderConstLocalName();
    test_ret += test_xmlTextReaderConstName();
    test_ret += test_xmlTextReaderConstNamespaceUri();
    test_ret += test_xmlTextReaderConstPrefix();
    test_ret += test_xmlTextReaderConstString();
    test_ret += test_xmlTextReaderConstValue();
    test_ret += test_xmlTextReaderConstXmlLang();
    test_ret += test_xmlTextReaderConstXmlVersion();
    test_ret += test_xmlTextReaderCurrentDoc();
    test_ret += test_xmlTextReaderCurrentNode();
    test_ret += test_xmlTextReaderDepth();
    test_ret += test_xmlTextReaderExpand();
    test_ret += test_xmlTextReaderGetAttribute();
    test_ret += test_xmlTextReaderGetAttributeNo();
    test_ret += test_xmlTextReaderGetAttributeNs();
    test_ret += test_xmlTextReaderGetErrorHandler();
    test_ret += test_xmlTextReaderGetParserColumnNumber();
    test_ret += test_xmlTextReaderGetParserLineNumber();
    test_ret += test_xmlTextReaderGetParserProp();
    test_ret += test_xmlTextReaderGetRemainder();
    test_ret += test_xmlTextReaderHasAttributes();
    test_ret += test_xmlTextReaderHasValue();
    test_ret += test_xmlTextReaderIsDefault();
    test_ret += test_xmlTextReaderIsEmptyElement();
    test_ret += test_xmlTextReaderIsNamespaceDecl();
    test_ret += test_xmlTextReaderIsValid();
    test_ret += test_xmlTextReaderLocalName();
    test_ret += test_xmlTextReaderLocatorBaseURI();
    test_ret += test_xmlTextReaderLocatorLineNumber();
    test_ret += test_xmlTextReaderLookupNamespace();
    test_ret += test_xmlTextReaderMoveToAttribute();
    test_ret += test_xmlTextReaderMoveToAttributeNo();
    test_ret += test_xmlTextReaderMoveToAttributeNs();
    test_ret += test_xmlTextReaderMoveToElement();
    test_ret += test_xmlTextReaderMoveToFirstAttribute();
    test_ret += test_xmlTextReaderMoveToNextAttribute();
    test_ret += test_xmlTextReaderName();
    test_ret += test_xmlTextReaderNamespaceUri();
    test_ret += test_xmlTextReaderNext();
    test_ret += test_xmlTextReaderNextSibling();
    test_ret += test_xmlTextReaderNodeType();
    test_ret += test_xmlTextReaderNormalization();
    test_ret += test_xmlTextReaderPrefix();
    test_ret += test_xmlTextReaderPreserve();
    test_ret += test_xmlTextReaderPreservePattern();
    test_ret += test_xmlTextReaderQuoteChar();
    test_ret += test_xmlTextReaderRead();
    test_ret += test_xmlTextReaderReadAttributeValue();
    test_ret += test_xmlTextReaderReadState();
    test_ret += test_xmlTextReaderRelaxNGSetSchema();
    test_ret += test_xmlTextReaderRelaxNGValidate();
    test_ret += test_xmlTextReaderRelaxNGValidateCtxt();
    test_ret += test_xmlTextReaderSchemaValidate();
    test_ret += test_xmlTextReaderSchemaValidateCtxt();
    test_ret += test_xmlTextReaderSetErrorHandler();
    test_ret += test_xmlTextReaderSetParserProp();
    test_ret += test_xmlTextReaderSetSchema();
    test_ret += test_xmlTextReaderSetStructuredErrorHandler();
    test_ret += test_xmlTextReaderSetup();
    test_ret += test_xmlTextReaderStandalone();
    test_ret += test_xmlTextReaderValue();
    test_ret += test_xmlTextReaderXmlLang();

    if (test_ret != 0)
	printf("Module xmlreader: %d errors\n", test_ret);
    return(test_ret);
}